

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlabKosorajo.c
# Opt level: O0

int feederBig(void)

{
  int iVar1;
  FILE *__stream;
  int local_20;
  int local_1c;
  int j;
  int i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%d\n",2000);
    fprintf(__stream,"%d\n",0x1e8098);
    for (local_1c = 0; iVar1 = local_1c, local_1c + 1 < 2000; local_1c = local_1c + 1) {
      while (local_20 = iVar1 + 1, local_20 < 2000) {
        fprintf(__stream,"%d %d\n",(ulong)(local_1c + 1),(ulong)(iVar1 + 2));
        iVar1 = local_20;
      }
    }
    fclose(__stream);
    LabMemoryLimit = 0x7d4f50;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");

    if (!in)
    {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    fprintf(in, "%d\n", N_MAX);
    fprintf(in, "%d\n", N_MAX * (N_MAX - 1) / 2);

    for (int i = 0; i + 1 < N_MAX; i++)
    {
        for (int j = i + 1; j < N_MAX; j++)
            fprintf(in, "%d %d\n", i + 1, j + 1);
    }

    fclose(in);

    LabMemoryLimit = N_MAX * 10 + N_MAX * (N_MAX - 1) + MIN_PROCESS_RSS_BYTES;

    return 0;
}